

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLexer.cpp
# Opt level: O2

string * __thiscall
json::JsonLexer::readDigits_abi_cxx11_
          (string *__return_storage_ptr__,JsonLexer *this,istream *input)

{
  long *plVar1;
  char c;
  char local_19;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while( true ) {
    plVar1 = (long *)std::istream::get((char *)this);
    if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) {
      return __return_storage_ptr__;
    }
    if (9 < (int)local_19 - 0x30U) break;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  std::istream::putback((char)this);
  return __return_storage_ptr__;
}

Assistant:

std::string JsonLexer::readDigits(std::istream &input)
    {
        std::string digits;
        char c;
        while (input.get(c))
        {
            if (isdigit(c))
            {
                digits += c;
            }
            else
            {
                // If we get something that's not a digit put it back into the stream and break the loop.
                input.putback(c);
                break;
            }
        }
        return digits;
    }